

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

char_int_type __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
::get(lexer<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
      *this)

{
  int iVar1;
  int_type iVar2;
  char_type local_11;
  lexer<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
  *local_10;
  lexer<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
  *this_local;
  
  (this->position).chars_read_total = (this->position).chars_read_total + 1;
  (this->position).chars_read_current_line = (this->position).chars_read_current_line + 1;
  local_10 = this;
  if ((this->next_unget & 1U) == 0) {
    iVar2 = iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>
            ::get_character(&this->ia);
    this->current = iVar2;
  }
  else {
    this->next_unget = false;
  }
  iVar1 = this->current;
  iVar2 = std::char_traits<char>::eof();
  if (iVar1 != iVar2) {
    local_11 = std::char_traits<char>::to_char_type(&this->current);
    std::vector<char,_std::allocator<char>_>::push_back(&this->token_string,&local_11);
  }
  if (this->current == 10) {
    (this->position).lines_read = (this->position).lines_read + 1;
    (this->position).chars_read_current_line = 0;
  }
  return this->current;
}

Assistant:

char_int_type get()
    {
        ++position.chars_read_total;
        ++position.chars_read_current_line;

        if (next_unget)
        {
            // just reset the next_unget variable and work with current
            next_unget = false;
        }
        else
        {
            current = ia.get_character();
        }

        if (JSON_HEDLEY_LIKELY(current != std::char_traits<char_type>::eof()))
        {
            token_string.push_back(std::char_traits<char_type>::to_char_type(current));
        }

        if (current == '\n')
        {
            ++position.lines_read;
            position.chars_read_current_line = 0;
        }

        return current;
    }